

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O0

void __thiscall
ScriptUtil_GetP2wshLockingScriptTest_Test::TestBody(ScriptUtil_GetP2wshLockingScriptTest_Test *this)

{
  allocator<ScriptUtil_ScriptTestVector> *this_00;
  initializer_list<ScriptUtil_ScriptTestVector> __l;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  ScriptUtil_ScriptTestVector *local_4d8;
  AssertHelper local_458;
  Message local_450;
  string local_448;
  string local_428;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_1;
  Message local_3f0;
  Script local_3e8;
  undefined1 local_3b0 [8];
  ByteData256 script_hash;
  Message local_390;
  string local_388;
  string local_368;
  undefined1 local_348 [8];
  AssertionResult gtest_ar;
  Message local_330 [2];
  Script local_320;
  reference local_2e8;
  ScriptUtil_ScriptTestVector *test_vector;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_> *__range1;
  Script actual;
  string local_288;
  allocator local_261;
  string local_260;
  undefined1 local_23a;
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  undefined1 local_1ea;
  allocator local_1e9;
  string local_1e8;
  allocator local_1b1;
  string local_1b0;
  ScriptUtil_ScriptTestVector *local_190;
  ScriptUtil_ScriptTestVector local_188;
  Script local_118;
  Script SStack_e0;
  Script local_a8;
  Script SStack_70;
  iterator local_38;
  pointer local_30;
  vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_> test_vectors;
  ScriptUtil_GetP2wshLockingScriptTest_Test *this_local;
  
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
  local_190 = &local_188;
  test_vectors.
  super__Vector_base<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1b0,"01000111022222033333330244440155026666037777770288880199",
             &local_1b1);
  cfd::core::Script::Script(&local_188.input_redeem_script,&local_1b0);
  local_1ea = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1e8,
             "002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437",&local_1e9);
  cfd::core::Script::Script(&local_188.expect_locking_script,&local_1e8);
  local_1ea = 0;
  local_190 = (ScriptUtil_ScriptTestVector *)&local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_210,"76a914edaf2414751239b72b653ea004adc310a3522e3788ac",&local_211);
  cfd::core::Script::Script(&local_118,&local_210);
  local_23a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_238,
             "002049672615b13c511f9cef005d2290211c5924e28da4d68f5a8c6dfd1f108bf388",&local_239);
  cfd::core::Script::Script(&SStack_e0,&local_238);
  local_23a = 0;
  local_190 = (ScriptUtil_ScriptTestVector *)&local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_260,"0014edaf2414751239b72b653ea004adc310a3522e37",&local_261);
  cfd::core::Script::Script(&local_a8,&local_260);
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_288,
             "0020c1a9921421f2ac0e76533e25ca211e6a1f9465bdf9931f5e9039dbdfdace0fa4",
             (allocator *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script(&SStack_70,&local_288);
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  local_38 = &local_188;
  local_30 = (pointer)0x3;
  this_00 = (allocator<ScriptUtil_ScriptTestVector> *)
            ((long)&actual.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  std::allocator<ScriptUtil_ScriptTestVector>::allocator(this_00);
  __l._M_len = (size_type)local_30;
  __l._M_array = local_38;
  std::vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>::vector
            ((vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_> *)
             &stack0xffffffffffffffd8,__l,this_00);
  std::allocator<ScriptUtil_ScriptTestVector>::~allocator
            ((allocator<ScriptUtil_ScriptTestVector> *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_4d8 = (ScriptUtil_ScriptTestVector *)&stack0xffffffffffffffc8;
  do {
    local_4d8 = local_4d8 + -1;
    ScriptUtil_ScriptTestVector::~ScriptUtil_ScriptTestVector(local_4d8);
  } while (local_4d8 != &local_188);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  cfd::core::Script::Script((Script *)&__range1);
  __end1 = std::vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>::
           begin((vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>
                  *)&stack0xffffffffffffffd8);
  test_vector = (ScriptUtil_ScriptTestVector *)
                std::
                vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>::
                end((vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>
                     *)&stack0xffffffffffffffd8);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_ScriptUtil_ScriptTestVector_*,_std::vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>_>
                                     *)&test_vector), bVar1) {
    local_2e8 = __gnu_cxx::
                __normal_iterator<const_ScriptUtil_ScriptTestVector_*,_std::vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>_>
                ::operator*(&__end1);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::ScriptUtil::CreateP2wshLockingScript(&local_320,&local_2e8->input_redeem_script);
        cfd::core::Script::operator=((Script *)&__range1,&local_320);
        cfd::core::Script::~Script(&local_320);
      }
    }
    else {
      testing::Message::Message(local_330);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x9f,
                 "Expected: (actual = ScriptUtil::CreateP2wshLockingScript(test_vector.input_redeem_script)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_330);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      testing::Message::~Message(local_330);
    }
    cfd::core::Script::GetHex_abi_cxx11_(&local_368,(Script *)&__range1);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cfd::core::Script::GetHex_abi_cxx11_(&local_388,&local_2e8->expect_locking_script);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_348,"actual.GetHex().c_str()",
               "test_vector.expect_locking_script.GetHex().c_str()",pcVar2,pcVar3);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_368);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
    if (!bVar1) {
      testing::Message::Message(&local_390);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &script_hash.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0xa0,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &script_hash.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_390);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &script_hash.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_390);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
    cfd::core::HashUtil::Sha256((ByteData256 *)local_3b0,&local_2e8->input_redeem_script);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::ScriptUtil::CreateP2wshLockingScript(&local_3e8,(ByteData256 *)local_3b0);
        cfd::core::Script::operator=((Script *)&__range1,&local_3e8);
        cfd::core::Script::~Script(&local_3e8);
      }
    }
    else {
      testing::Message::Message(&local_3f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0xa2,
                 "Expected: (actual = ScriptUtil::CreateP2wshLockingScript(script_hash)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_3f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_3f0);
    }
    cfd::core::Script::GetHex_abi_cxx11_(&local_428,(Script *)&__range1);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cfd::core::Script::GetHex_abi_cxx11_(&local_448,&local_2e8->expect_locking_script);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_408,"actual.GetHex().c_str()",
               "test_vector.expect_locking_script.GetHex().c_str()",pcVar2,pcVar3);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_428);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
    if (!bVar1) {
      testing::Message::Message(&local_450);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
      testing::internal::AssertHelper::AssertHelper
                (&local_458,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0xa3,pcVar2);
      testing::internal::AssertHelper::operator=(&local_458,&local_450);
      testing::internal::AssertHelper::~AssertHelper(&local_458);
      testing::Message::~Message(&local_450);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
    cfd::core::ByteData256::~ByteData256((ByteData256 *)local_3b0);
    __gnu_cxx::
    __normal_iterator<const_ScriptUtil_ScriptTestVector_*,_std::vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>_>
    ::operator++(&__end1);
  }
  cfd::core::Script::~Script((Script *)&__range1);
  std::vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_>::~vector
            ((vector<ScriptUtil_ScriptTestVector,_std::allocator<ScriptUtil_ScriptTestVector>_> *)
             &stack0xffffffffffffffd8);
  return;
}

Assistant:

TEST(ScriptUtil, GetP2wshLockingScriptTest) {
  const std::vector<ScriptUtil_ScriptTestVector> test_vectors = {
    {
      // 00 11 2222 333333 4444 55 6666 777777 8888 99
      Script("01000111022222033333330244440155026666037777770288880199"),
      Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437")
    },
    {
      // p2pkh locking script
      Script("76a914edaf2414751239b72b653ea004adc310a3522e3788ac"),
      Script("002049672615b13c511f9cef005d2290211c5924e28da4d68f5a8c6dfd1f108bf388")
    },
    {
      // p2wpkh locking script
      Script("0014edaf2414751239b72b653ea004adc310a3522e37"),
      Script("0020c1a9921421f2ac0e76533e25ca211e6a1f9465bdf9931f5e9039dbdfdace0fa4")
    },
  };

  Script actual;
  for (const ScriptUtil_ScriptTestVector& test_vector : test_vectors) {
    EXPECT_NO_THROW((actual = ScriptUtil::CreateP2wshLockingScript(test_vector.input_redeem_script)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_locking_script.GetHex().c_str());
    ByteData256 script_hash = HashUtil::Sha256(test_vector.input_redeem_script);
    EXPECT_NO_THROW((actual = ScriptUtil::CreateP2wshLockingScript(script_hash)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_locking_script.GetHex().c_str());
  }
}